

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Event.h
# Opt level: O0

EventSignalPtr * __thiscall entityx::EventManager::signal_for(EventManager *this,size_t id)

{
  bool bVar1;
  vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
  *pvVar2;
  __shared_ptr *this_00;
  reference pvVar3;
  vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
  *in_RSI;
  shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_> *in_RDI;
  shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
  *in_stack_ffffffffffffffc8;
  size_type in_stack_ffffffffffffffe8;
  vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
  *this_01;
  
  this_01 = in_RSI;
  pvVar2 = (vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
            *)Catch::clara::std::
              vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
              ::size((vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
                      *)&(in_RDI->
                         super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                         )._M_refcount);
  if (pvVar2 <= in_RSI) {
    Catch::clara::std::
    vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
    ::resize(this_01,in_stack_ffffffffffffffe8);
  }
  this_00 = (__shared_ptr *)
            Catch::clara::std::
            vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
            ::operator[]((vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
                          *)&(in_RDI->
                             super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                             )._M_refcount,(size_type)this_01);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
  if (!bVar1) {
    std::make_shared<Simple::Signal<void(void_const*),Simple::Lib::CollectorDefault<void>>>();
    Catch::clara::std::
    vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
    ::operator[]((vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
                  *)&(in_RDI->
                     super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                     )._M_refcount,(size_type)this_01);
    Catch::clara::std::
    shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::
    operator=(in_RDI,in_stack_ffffffffffffffc8);
    Catch::clara::std::
    shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>::
    ~shared_ptr((shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>
                 *)0x2a36c2);
  }
  pvVar3 = Catch::clara::std::
           vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
           ::operator[]((vector<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>,_std::allocator<std::shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>_>_>_>
                         *)&(in_RDI->
                            super___shared_ptr<Simple::Signal<void_(const_void_*),_Simple::Lib::CollectorDefault<void>_>,_(__gnu_cxx::_Lock_policy)2>
                            )._M_refcount,(size_type)this_01);
  return pvVar3;
}

Assistant:

EventSignalPtr &signal_for(std::size_t id) {
    if (id >= handlers_.size())
      handlers_.resize(id + 1);
    if (!handlers_[id])
      handlers_[id] = std::make_shared<EventSignal>();
    return handlers_[id];
  }